

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_szvp.c
# Opt level: O2

ares_bool_t ares_htable_szvp_get(ares_htable_szvp_t *htable,size_t key,void **val)

{
  ares_bool_t aVar1;
  void *pvVar2;
  size_t key_local;
  
  if (val != (void **)0x0) {
    *val = (void *)0x0;
  }
  if (htable == (ares_htable_szvp_t *)0x0) {
    aVar1 = ARES_FALSE;
  }
  else {
    key_local = key;
    pvVar2 = ares_htable_get(htable->hash,&key_local);
    if (pvVar2 != (void *)0x0 && val != (void **)0x0) {
      *val = *(void **)((long)pvVar2 + 8);
      aVar1 = ARES_TRUE;
    }
    else {
      aVar1 = (ares_bool_t)(pvVar2 != (void *)0x0);
    }
  }
  return aVar1;
}

Assistant:

ares_bool_t ares_htable_szvp_get(const ares_htable_szvp_t *htable, size_t key,
                                 void **val)
{
  ares_htable_szvp_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, &key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}